

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O2

Compressor *
Imf_2_5::newTileCompressor(Compression c,size_t tileLineSize,size_t numTileLines,Header *hdr)

{
  DwaCompressor *this;
  unsigned_long maxScanLineSize;
  
  switch(c) {
  case RLE_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x28);
    maxScanLineSize = uiMult<unsigned_long>(tileLineSize,numTileLines);
    RleCompressor::RleCompressor((RleCompressor *)this,hdr,maxScanLineSize);
    break;
  case ZIPS_COMPRESSION:
  case ZIP_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x30);
    ZipCompressor::ZipCompressor((ZipCompressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case PIZ_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    PizCompressor::PizCompressor((PizCompressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case PXR24_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x40);
    Pxr24Compressor::Pxr24Compressor((Pxr24Compressor *)this,hdr,tileLineSize,numTileLines);
    break;
  case B44_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,tileLineSize,numTileLines,false);
    break;
  case B44A_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x58);
    B44Compressor::B44Compressor((B44Compressor *)this,hdr,tileLineSize,numTileLines,true);
    break;
  case DWAA_COMPRESSION:
  case DWAB_COMPRESSION:
    this = (DwaCompressor *)operator_new(0x128);
    DwaCompressor::DwaCompressor(this,hdr,(int)tileLineSize,(int)numTileLines,DEFLATE);
    break;
  default:
    this = (DwaCompressor *)0x0;
  }
  return &this->super_Compressor;
}

Assistant:

Compressor *
newTileCompressor (Compression c,
		   size_t tileLineSize,
		   size_t numTileLines,
		   const Header &hdr)
{
    switch (c)
    {
      case RLE_COMPRESSION:

	return new RleCompressor (hdr, uiMult (tileLineSize, numTileLines));

      case ZIPS_COMPRESSION:
      case ZIP_COMPRESSION:

	return new ZipCompressor (hdr, tileLineSize, numTileLines);

      case PIZ_COMPRESSION:

	return new PizCompressor (hdr, tileLineSize, numTileLines);

      case PXR24_COMPRESSION:

	return new Pxr24Compressor (hdr, tileLineSize, numTileLines);

      case B44_COMPRESSION:

	return new B44Compressor (hdr, tileLineSize, numTileLines, false);

      case B44A_COMPRESSION:

	return new B44Compressor (hdr, tileLineSize, numTileLines, true);

      case DWAA_COMPRESSION:
      case DWAB_COMPRESSION:

	return new DwaCompressor (hdr, tileLineSize, numTileLines, 
                               DwaCompressor::DEFLATE);

      default:

	return 0;
    }
}